

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRationalBezierCurve::~IfcRationalBezierCurve
          (IfcRationalBezierCurve *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x2a];
  *(void **)&this->field_0x10 = vtt[0x2b];
  *(void **)&this->field_0x20 = vtt[0x2c];
  *(void **)&this->field_0x30 = vtt[0x2d];
  *(void **)&this->field_0x40 = vtt[0x2e];
  *(void **)&this->field_0xb0 = vtt[0x2f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x30];
  pvVar1 = *(void **)&(this->
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>
                                     ).field_0x20 - (long)pvVar1);
  }
  pvVar1 = vtt[2];
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x1b];
  *(void **)&this->field_0x10 = vtt[0x1c];
  *(void **)&this->field_0x20 = vtt[0x1d];
  *(void **)&this->field_0x30 = vtt[0x1e];
  *(void **)&this->field_0x40 = vtt[0x1f];
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0xa8 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0xa8);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x98 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x98);
  }
  if (*(undefined1 **)&this->field_0x70 != &this->field_0x80) {
    operator_delete(*(undefined1 **)&this->field_0x70,*(long *)&this->field_0x80 + 1);
  }
  pvVar1 = *(void **)&this->field_0x58;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x68 - (long)pvVar1);
    return;
  }
  return;
}

Assistant:

IfcRationalBezierCurve() : Object("IfcRationalBezierCurve") {}